

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O0

void __thiscall Executor::visit(Executor *this,BlockNode *node)

{
  bool bVar1;
  pointer pSVar2;
  BlockNode *in_RSI;
  list<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>,_std::allocator<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>_>_>
  *in_RDI;
  unique_ptr<StatementNode,_std::default_delete<StatementNode>_> *statement;
  const_iterator __end1;
  const_iterator __begin1;
  list<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>,_std::allocator<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>_>_>
  *__range1;
  _List_const_iterator<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>_>
  *in_stack_ffffffffffffffd0;
  _Self local_28;
  _Self local_20;
  list<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>,_std::allocator<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>_>_>
  *local_18;
  
  local_18 = BlockNode::getStatements_abi_cxx11_(in_RSI);
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>,_std::allocator<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>_>_>
       ::begin(in_RDI);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>,_std::allocator<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>_>_>
       ::end(in_RDI);
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         (_List_const_iterator<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>_>
          *)std::
            _List_const_iterator<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>_>
            ::operator*(in_stack_ffffffffffffffd0);
    pSVar2 = std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>::operator->
                       ((unique_ptr<StatementNode,_std::default_delete<StatementNode>_> *)0x15aaf2);
    (*(pSVar2->super_Node)._vptr_Node[2])(pSVar2,in_RDI);
    std::_List_const_iterator<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void Executor::visit(const BlockNode& node)
{
  for(const auto& statement: node.getStatements())
   statement->accept(*this);
}